

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O3

void cache_block(BGZF *fp,int size)

{
  undefined4 uVar1;
  undefined4 uVar2;
  kh_cache_t *h;
  khint64_t kVar3;
  khint32_t *pkVar4;
  cache_t *pcVar5;
  khint_t kVar6;
  int iVar7;
  uint8_t *__dest;
  sbyte sVar8;
  byte bVar9;
  khint_t kVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  khint_t kVar17;
  bool bVar18;
  bool bVar19;
  
  if (fp->cache_size < 0x10001) {
    return;
  }
  h = (kh_cache_t *)fp->cache;
  kVar17 = h->n_buckets;
  if ((uint)fp->cache_size < h->size * 0x10000 + 0x10000) {
    if (kVar17 == 0) {
      kVar17 = 0;
    }
    else {
      lVar11 = 4;
      uVar13 = 0;
      uVar16 = 0;
      do {
        uVar12 = 3 << (sbyte)(uVar13 & 0x1e);
        uVar15 = uVar16 >> 4;
        if ((h->flags[uVar15] & uVar12) == 0) {
          free(*(void **)((long)&h->vals->size + lVar11 * 2));
          kVar17 = uVar16;
          if (h->n_buckets != uVar16) {
            uVar16 = h->flags[uVar15];
            kVar17 = h->n_buckets;
            if ((uVar16 & uVar12) == 0) {
              h->flags[uVar15] = uVar16 | 1 << (uVar13 & 0x1e);
              h->size = h->size - 1;
              kVar17 = h->n_buckets;
            }
          }
          break;
        }
        uVar16 = uVar16 + 1;
        lVar11 = lVar11 + 0xc;
        uVar13 = uVar13 + 2;
      } while (kVar17 != uVar16);
    }
  }
  kVar3 = fp->block_address;
  if (h->upper_bound <= h->n_occupied) {
    if (h->size * 2 < kVar17) {
      kVar17 = kVar17 - 1;
    }
    else {
      kVar17 = kVar17 + 1;
    }
    iVar7 = kh_resize_cache(h,kVar17);
    kVar17 = h->n_buckets;
    if (iVar7 < 0) goto LAB_00133ac7;
  }
  uVar13 = ((uint)(kVar3 >> 0x21) ^ (uint)kVar3 << 0xb ^ (uint)kVar3) & kVar17 - 1;
  pkVar4 = h->flags;
  kVar6 = uVar13;
  if ((pkVar4[uVar13 >> 4] >> ((char)uVar13 * '\x02' & 0x1fU) & 2) == 0) {
    iVar7 = 1;
    kVar10 = kVar17;
    uVar16 = uVar13;
    do {
      uVar12 = pkVar4[uVar16 >> 4];
      uVar15 = uVar16 * 2 & 0x1e;
      sVar8 = (sbyte)uVar15;
      uVar14 = uVar12 >> sVar8;
      if (((uVar14 & 2) != 0) || (((uVar14 & 1) == 0 && (h->keys[uVar16] == kVar3)))) {
        bVar19 = (uVar12 >> sVar8 & 2) == 0;
        goto LAB_00133a3e;
      }
      if ((uVar12 >> uVar15 & 1) != 0) {
        kVar10 = uVar16;
      }
      uVar16 = uVar16 + iVar7 & kVar17 - 1;
      iVar7 = iVar7 + 1;
    } while (uVar16 != uVar13);
    bVar19 = true;
    bVar18 = kVar10 == kVar17;
    kVar6 = kVar10;
    uVar16 = uVar13;
    kVar10 = kVar17;
    if (bVar18) {
LAB_00133a3e:
      if (kVar10 == kVar17) {
        kVar10 = uVar16;
      }
      kVar6 = kVar10;
      if (bVar19) {
        kVar6 = uVar16;
      }
    }
  }
  kVar17 = kVar6;
  uVar16 = kVar17 >> 4;
  uVar13 = pkVar4[uVar16];
  bVar9 = (char)kVar17 * '\x02' & 0x1e;
  if ((uVar13 >> bVar9 & 2) == 0) {
    if ((uVar13 >> bVar9 & 1) == 0) {
      return;
    }
    h->keys[kVar17] = kVar3;
    pkVar4[uVar16] = uVar13 & ~(3 << bVar9);
    h->size = h->size + 1;
  }
  else {
    h->keys[kVar17] = kVar3;
    pkVar4[uVar16] = uVar13 & ~(3 << bVar9);
    uVar1 = h->size;
    uVar2 = h->n_occupied;
    h->size = uVar1 + 1;
    h->n_occupied = uVar2 + 1;
  }
LAB_00133ac7:
  pcVar5 = h->vals;
  pcVar5[kVar17].size = fp->block_length;
  pcVar5[kVar17].end_offset = (long)size + fp->block_address;
  __dest = (uint8_t *)malloc(0x10000);
  pcVar5[kVar17].block = __dest;
  memcpy(__dest,fp->uncompressed_block,0x10000);
  return;
}

Assistant:

static void cache_block(BGZF *fp, int size)
{
    int ret;
    khint_t k;
    cache_t *p;
    khash_t(cache) *h = (khash_t(cache)*)fp->cache;
    if (BGZF_MAX_BLOCK_SIZE >= fp->cache_size) return;
    if ((kh_size(h) + 1) * BGZF_MAX_BLOCK_SIZE > (uint32_t)fp->cache_size) {
        /* A better way would be to remove the oldest block in the
         * cache, but here we remove a random one for simplicity. This
         * should not have a big impact on performance. */
        for (k = kh_begin(h); k < kh_end(h); ++k)
            if (kh_exist(h, k)) break;
        if (k < kh_end(h)) {
            free(kh_val(h, k).block);
            kh_del(cache, h, k);
        }
    }
    k = kh_put(cache, h, fp->block_address, &ret);
    if (ret == 0) return; // if this happens, a bug!
    p = &kh_val(h, k);
    p->size = fp->block_length;
    p->end_offset = fp->block_address + size;
    p->block = (uint8_t*)malloc(BGZF_MAX_BLOCK_SIZE);
    memcpy(kh_val(h, k).block, fp->uncompressed_block, BGZF_MAX_BLOCK_SIZE);
}